

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O2

bool __thiscall
Inferences::InductionClauseIterator::notDoneInt
          (InductionClauseIterator *this,InductionContext *context,Literal *bound1,Literal *bound2,
          Entry **e)

{
  uint uVar1;
  bool bVar2;
  TermList arg1;
  ulong uVar3;
  Literal *bound1_00;
  Literal *bound2_00;
  TermList arg1_00;
  undefined1 polarity;
  Term *pTVar4;
  TermList arg2;
  
  bound1_00 = (Literal *)0x0;
  arg2._content = (uint64_t)e;
  arg1._content = (uint64_t)getPlaceholderForTerm(&context->_indTerms,0);
  if (bound1 != (Literal *)0x0) {
    uVar1 = (uint)(bound1->super_Term)._args[0]._content;
    uVar3 = (ulong)(*(uint *)&(bound1->super_Term).field_0xc & 0xfffffff);
    if ((uVar1 >> 2 & 1) == 0) {
      arg1_00._content = (bound1->super_Term)._args[uVar3 - 1]._content;
      pTVar4 = (Term *)arg1._content;
    }
    else {
      pTVar4 = (Term *)(bound1->super_Term)._args[uVar3]._content;
      arg1_00._content = arg1._content;
    }
    bound1_00 = Kernel::Literal::create2
                          ((Literal *)(ulong)(bound1->super_Term)._functor,uVar1 >> 2 & 1,
                           SUB81(pTVar4,0),arg1_00,arg2);
  }
  if (bound2 == (Literal *)0x0) {
    bound2_00 = (Literal *)0x0;
  }
  else {
    uVar1 = (uint)(bound2->super_Term)._args[0]._content;
    uVar3 = (ulong)(*(uint *)&(bound2->super_Term).field_0xc & 0xfffffff);
    if ((uVar1 >> 2 & 1) == 0) {
      polarity = (undefined1)(bound2->super_Term)._args[uVar3]._content;
    }
    else {
      polarity = (undefined1)arg1._content;
      arg1._content = (bound2->super_Term)._args[uVar3 - 1]._content;
    }
    bound2_00 = Kernel::Literal::create2
                          ((Literal *)(ulong)(bound2->super_Term)._functor,uVar1 >> 2 & 1,
                           (bool)polarity,arg1,arg2);
  }
  bVar2 = Indexing::InductionFormulaIndex::findOrInsert
                    (this->_formulaIndex,context,e,bound1_00,bound2_00);
  return bVar2;
}

Assistant:

bool InductionClauseIterator::notDoneInt(InductionContext context, Literal* bound1, Literal* bound2, InductionFormulaIndex::Entry*& e)
{
  ASS_EQ(context._indTerms.size(), 1);
  TermList ph(getPlaceholderForTerm(context._indTerms,0));
  Literal* b1 = nullptr;
  Literal* b2 = nullptr;
  if (bound1) {
    b1 = Literal::create2(bound1->functor(), bound1->polarity(),
      bound1->polarity() ? *bound1->nthArgument(0) : ph,
      bound1->polarity() ? ph : *bound1->nthArgument(1));
  }
  if (bound2) {
    b2 = Literal::create2(bound2->functor(), bound2->polarity(),
      bound2->polarity() ? ph : *bound2->nthArgument(0),
      bound2->polarity() ? *bound2->nthArgument(1) : ph);
  }
  return _formulaIndex.findOrInsert(context, e, b1, b2);
}